

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_io_object.hpp
# Opt level: O2

void __thiscall
boost::asio::
basic_io_object<boost::asio::detail::deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_true>
::basic_io_object(basic_io_object<boost::asio::detail::deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_true>
                  *this,io_context *io_context)

{
  deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  *pdVar1;
  
  pdVar1 = use_service<boost::asio::detail::deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,boost::asio::wait_traits<std::chrono::_V2::steady_clock>>>>
                     (io_context);
  this->service_ = pdVar1;
  (this->implementation_).timer_data.op_queue_.front_ = (wait_op *)0x0;
  (this->implementation_).timer_data.op_queue_.back_ = (wait_op *)0x0;
  (this->implementation_).timer_data.heap_index_ = 0xffffffffffffffff;
  (this->implementation_).timer_data.next_ = (per_timer_data *)0x0;
  (this->implementation_).timer_data.prev_ = (per_timer_data *)0x0;
  (this->implementation_).expiry.__d.__r = 0;
  (this->implementation_).might_have_pending_waits = false;
  return;
}

Assistant:

explicit basic_io_object(boost::asio::io_context& io_context)
    : service_(&boost::asio::use_service<IoObjectService>(io_context))
  {
    service_->construct(implementation_);
  }